

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getSaveGamesFolder1.cpp
# Opt level: O0

int main(void)

{
  string local_68;
  PlatformFolders local_48;
  PlatformFolders p;
  string local_30;
  int local_c;
  
  local_c = 0;
  sago::getSaveGamesFolder1_abi_cxx11_();
  run_test(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  sago::PlatformFolders::PlatformFolders(&local_48);
  sago::PlatformFolders::getSaveGamesFolder1_abi_cxx11_(&local_68,&local_48);
  run_test(&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  local_c = 0;
  sago::PlatformFolders::~PlatformFolders(&local_48);
  return local_c;
}

Assistant:

int main() {
	run_test(sago::getSaveGamesFolder1());
	sago::PlatformFolders p;
	run_test(p.getSaveGamesFolder1());
	return 0;
}